

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

int ReadFileToCStringsList(CStringsList **f,char *end)

{
  int iVar1;
  int iVar2;
  CStringsList *this;
  CStringsList **ppCVar3;
  bool SplitByColon;
  bool bVar4;
  char *p;
  char *local_40;
  CStringsList **local_38;
  
  SplitByColon = true;
  bVar4 = true;
  local_38 = f;
  do {
    iVar1 = ReadLineNoMacro(SplitByColon);
    if (iVar1 == 0) {
      return 0;
    }
    CompiledCurrentLine = CompiledCurrentLine + 1;
    local_40 = line;
    SkipBlanks(&local_40);
    if (*local_40 == '.') {
      local_40 = local_40 + 1;
    }
    iVar1 = cmphstr(&local_40,end,false);
    if (iVar1 == 0) {
      this = (CStringsList *)operator_new(0x28);
      CStringsList::CStringsList(this,line,(CStringsList *)0x0);
      *local_38 = this;
      ppCVar3 = &this->next;
      ListFile(true);
      if (bVar4 == false) {
        iVar2 = cmphstr(&local_40,"endlua",false);
        bVar4 = SplitByColon;
        local_38 = ppCVar3;
        if (iVar2 != 0) {
          bVar4 = true;
          SplitByColon = true;
        }
      }
      else {
        iVar2 = cmphstr(&local_40,"lua",false);
        bVar4 = SplitByColon;
        local_38 = ppCVar3;
        if (iVar2 != 0) {
          bVar4 = false;
          SplitByColon = false;
        }
      }
    }
    else {
      lp = ReplaceDefine(local_40);
    }
  } while (iVar1 == 0);
  return 1;
}

Assistant:

int ReadFileToCStringsList(CStringsList*& f, const char* end) {
	// f itself should be already NULL, not resetting it here
	CStringsList** s = &f;
	bool SplitByColon = true;
	while (ReadLineNoMacro(SplitByColon)) {
		++CompiledCurrentLine;
		char* p = line;
		SkipBlanks(p);
		if ('.' == *p) ++p;
		if (cmphstr(p, end)) {		// finished, read rest after end marker into line buffers
			lp = ReplaceDefine(p);
			return 1;
		}
		*s = new CStringsList(line);
		s = &((*s)->next);
		ListFile(true);
		// Try to ignore colons inside lua blocks... this is far from bulletproof, but should improve it
		if (SplitByColon && cmphstr(p, "lua")) {
			SplitByColon = false;
		} else if (!SplitByColon && cmphstr(p, "endlua")) {
			SplitByColon = true;
		}
	}
	return 0;
}